

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O1

bool __thiscall
iutest::detail::EachMatcher<iutest::detail::NeMatcher<int>>::
Each<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (EachMatcher<iutest::detail::NeMatcher<int>> *this,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  bool bVar1;
  bool bVar2;
  AssertionResult local_80;
  AssertionResult local_58;
  
  bVar2 = begin._M_current == end._M_current;
  if (!bVar2) {
    do {
      NeMatcher<int>::operator()(&local_80,(NeMatcher<int> *)(this + 8),begin._M_current);
      AssertionResult::operator!(&local_58,&local_80);
      bVar1 = local_58.m_result;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.m_message._M_dataplus._M_p != &local_58.m_message.field_2) {
        operator_delete(local_58.m_message._M_dataplus._M_p,
                        local_58.m_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
        operator_delete(local_80.m_message._M_dataplus._M_p,
                        local_80.m_message.field_2._M_allocated_capacity + 1);
      }
      if (bVar1 != false) {
        return bVar2;
      }
      begin._M_current = begin._M_current + 1;
      bVar2 = begin._M_current == end._M_current;
    } while (!bVar2);
  }
  return bVar2;
}

Assistant:

::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        return ElementsAreMatcherBase::WhichIs<0>(m_matchers);
    }